

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O3

void * tommy_hashdyn_remove_existing(tommy_hashdyn *hashdyn,tommy_hashdyn_node *node)

{
  uint uVar1;
  long lVar2;
  tommy_hashdyn_node **pptVar3;
  tommy_hashdyn_node *ptVar4;
  tommy_node_struct *ptVar5;
  uint uVar6;
  tommy_node_struct *ptVar7;
  tommy_node_struct *ptVar8;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = hashdyn->bucket_mask;
  uVar1 = node->key;
  pptVar3 = hashdyn->bucket;
  ptVar4 = ((tommy_node_struct *)(pptVar3 + (uVar6 & uVar1)))->next;
  ptVar5 = node->next;
  ptVar7 = node->prev;
  ptVar8 = ptVar5;
  if (ptVar5 == (tommy_node_struct *)0x0) {
    ptVar8 = ptVar4;
  }
  ptVar8->prev = ptVar7;
  if (ptVar4 == node) {
    ptVar7 = (tommy_node_struct *)(pptVar3 + (uVar6 & uVar1));
  }
  ptVar7->next = ptVar5;
  uVar6 = hashdyn->count - 1;
  hashdyn->count = uVar6;
  if ((uVar6 <= hashdyn->bucket_max >> 3) && (4 < hashdyn->bucket_bit)) {
    tommy_hashdyn_resize(hashdyn,hashdyn->bucket_bit - 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return node->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_hashdyn_remove_existing(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node)
{
	tommy_count_t pos = node->key & hashdyn->bucket_mask;

	tommy_list_remove_existing(&hashdyn->bucket[pos], node);

	--hashdyn->count;

	hashdyn_shrink_step(hashdyn);

	return node->data;
}